

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O0

Image * ImageIO::readImage(string *fileName)

{
  __type _Var1;
  uint width_00;
  uint height_00;
  char *__filename;
  FILE *__stream;
  ostream *poVar2;
  uchar *imageInfo_00;
  uchar *data_00;
  Image *this;
  Image *image;
  uchar *data;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [8];
  string bmpStr;
  Tools local_c8 [32];
  int local_a8;
  int i_1;
  Tools local_98 [36];
  int local_74;
  string local_70 [4];
  int i;
  string imageHeightStr;
  string local_50 [8];
  string imageWidthStr;
  uint local_2c;
  uint dataSize;
  uint height;
  uint width;
  uchar *imageInfo;
  FILE *imageFile;
  string *fileName_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"rb+");
  if (__stream == (FILE *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_41d9);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  imageInfo_00 = (uchar *)operator_new__(0x36);
  fread(imageInfo_00,1,0x36,__stream);
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  for (local_74 = 0x12; local_74 < 0x16; local_74 = local_74 + 1) {
    Tools::Char2Hex_abi_cxx11_(local_98,imageInfo_00[local_74]);
    std::__cxx11::string::insert((ulong)local_50,(string *)0x0);
    std::__cxx11::string::~string((string *)local_98);
  }
  width_00 = std::__cxx11::stoi((string *)local_50,(size_t *)0x0,0x10);
  for (local_a8 = 0x16; local_a8 < 0x1a; local_a8 = local_a8 + 1) {
    Tools::Char2Hex_abi_cxx11_(local_c8,imageInfo_00[local_a8]);
    std::__cxx11::string::insert((ulong)local_70,(string *)0x0);
    std::__cxx11::string::~string((string *)local_c8);
  }
  height_00 = std::__cxx11::stoi((string *)local_70,(size_t *)0x0,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"yuv",&local_e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_110,(ulong)fileName);
  poVar2 = std::operator<<((ostream *)&std::cout,local_110);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&data,(ulong)fileName);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data
                          ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e8);
  std::__cxx11::string::~string((string *)&data);
  if (_Var1) {
    local_2c = width_00 * height_00 * 3 >> 1;
  }
  else {
    local_2c = width_00 * height_00 * 3;
  }
  fseek(__stream,0x36,0);
  data_00 = (uchar *)operator_new__((ulong)local_2c);
  fread(data_00,1,(ulong)local_2c,__stream);
  fclose(__stream);
  this = (Image *)operator_new(0x20);
  Image::Image(this,imageInfo_00,data_00,width_00,height_00,local_2c);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

Image * ImageIO::readImage(string & fileName){
	FILE * imageFile = fopen(fileName.c_str(), "rb+");	
	if(imageFile == nullptr){
		cout<<"空文件"<<endl;
		exit(EXIT_FAILURE);
	}

	//读文件头
	uchar * imageInfo = new uchar[imageInfoHeadSize];
	fread(imageInfo, sizeof(uchar), imageInfoHeadSize, imageFile);


	uint width, height, dataSize;
	string imageWidthStr, imageHeightStr;

	for(int i = imageWidthPosition; i < imageWidthPosition + 4; i++){
		imageWidthStr.insert(0, Tools::Char2Hex(imageInfo[i]));
	}
	width = stoi(imageWidthStr, nullptr, 16);

	for(int i = imageHeightPosition; i < imageHeightPosition + 4; i++){
		imageHeightStr.insert(0, Tools::Char2Hex(imageInfo[i]));
	}
	height = stoi(imageHeightStr, nullptr, 16);

	string bmpStr = "yuv";
	cout<<fileName.substr(fileName.length()-3, 3)<<endl;
	if(fileName.substr(fileName.length()-3, 3) == bmpStr){
		dataSize = (width * height * 3) / 2;
	}else{
		dataSize = width * height * 3;
	}
	
	//cout<<"dataSize:"<<dataSize<<endl;

	//读图像数据
	fseek(imageFile, imageInfoHeadSize, 0);
	uchar * data = new uchar[dataSize];
	fread(data, sizeof(uchar), dataSize, imageFile);
	fclose(imageFile);

	Image * image = new Image(imageInfo, data, width, height, dataSize);

	return image;
}